

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void P_GetFloorCeilingZ(FCheckPosition *tmf,int flags)

{
  double dVar1;
  int iVar2;
  sector_t *this;
  AActor *pAVar3;
  FTextureID *pFVar4;
  sector_t *this_00;
  F3DFloor *ffc;
  F3DFloor *fff;
  DVector2 local_48;
  F3DFloor *local_30;
  
  if (((flags & 2U) == 0) || (pAVar3 = tmf->thing, pAVar3->Sector == (sector_t *)0x0)) {
    local_48.X = (tmf->pos).X;
    local_48.Y = (tmf->pos).Y;
    this = P_PointInSector(&local_48);
    pAVar3 = tmf->thing;
  }
  else {
    this = tmf->sector;
  }
  dVar1 = (tmf->pos).Z;
  dVar1 = sector_t::NextHighestCeilingAt
                    (this,(tmf->pos).X,(tmf->pos).Y,dVar1,pAVar3->Height + dVar1,flags,
                     &tmf->ceilingsector,(F3DFloor **)&local_48);
  tmf->ceilingz = dVar1;
  dVar1 = sector_t::NextLowestFloorAt
                    (this,(tmf->pos).X,(tmf->pos).Y,(tmf->pos).Z,flags,tmf->thing->MaxStepHeight,
                     &tmf->floorsector,&local_30);
  tmf->dropoffz = dVar1;
  tmf->floorz = dVar1;
  if (local_30 == (F3DFloor *)0x0) {
    this_00 = tmf->floorsector;
    (tmf->floorpic).texnum = this_00->planes[0].Texture.texnum;
    iVar2 = 0;
  }
  else {
    (tmf->floorpic).texnum = ((local_30->top).texture)->texnum;
    this_00 = local_30->model;
    iVar2 = (local_30->top).isceiling;
  }
  iVar2 = sector_t::GetTerrain(this_00,iVar2);
  tmf->floorterrain = iVar2;
  if (local_48.X == 0.0) {
    pFVar4 = &tmf->ceilingsector->planes[1].Texture;
  }
  else {
    pFVar4 = *(FTextureID **)((long)local_48.X + 8);
  }
  (tmf->ceilingpic).texnum = pFVar4->texnum;
  tmf->sector = this;
  return;
}

Assistant:

void P_GetFloorCeilingZ(FCheckPosition &tmf, int flags)
{
	sector_t *sec = (!(flags & FFCF_SAMESECTOR) || tmf.thing->Sector == NULL)? P_PointInSector(tmf.pos) : tmf.sector;
	F3DFloor *ffc, *fff;

	tmf.ceilingz = sec->NextHighestCeilingAt(tmf.pos.X, tmf.pos.Y, tmf.pos.Z, tmf.pos.Z + tmf.thing->Height, flags, &tmf.ceilingsector, &ffc);
	tmf.floorz = tmf.dropoffz = sec->NextLowestFloorAt(tmf.pos.X, tmf.pos.Y, tmf.pos.Z, flags, tmf.thing->MaxStepHeight, &tmf.floorsector, &fff);

	if (fff)
	{
		tmf.floorpic = *fff->top.texture;
		tmf.floorterrain = fff->model->GetTerrain(fff->top.isceiling);
	}
	else
	{
		tmf.floorpic = tmf.floorsector->GetTexture(sector_t::floor);
		tmf.floorterrain = tmf.floorsector->GetTerrain(sector_t::floor);
	}
	tmf.ceilingpic = ffc ? *ffc->bottom.texture : tmf.ceilingsector->GetTexture(sector_t::ceiling);
	tmf.sector = sec;

}